

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O0

vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          list<char,_std::allocator<char>_> *collections,
          list<char,_std::allocator<char>_> *collections_1)

{
  initializer_list<boost::iterator_range<std::_List_iterator<char>_>_> values;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  local_58;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
  local_48;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  *local_38;
  undefined8 local_30;
  list<char,_std::allocator<char>_> *local_28;
  list<char,_std::allocator<char>_> *collections_local_1;
  list<char,_std::allocator<char>_> *collections_local;
  make_range_vector_t *this_local;
  
  local_28 = collections_1;
  collections_local_1 = collections;
  collections_local = (list<char,_std::allocator<char>_> *)this;
  this_local = (make_range_vector_t *)__return_storage_ptr__;
  local_58 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
              )boost::make_iterator_range<std::__cxx11::list<char,std::allocator<char>>>
                         (collections);
  local_48.
  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          )boost::make_iterator_range<std::__cxx11::list<char,std::allocator<char>>>(local_28);
  local_38 = &local_58;
  local_30 = 2;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x2;
  make_vector<boost::iterator_range<std::_List_iterator<char>>>
            (__return_storage_ptr__,(burst *)local_38,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }